

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

int FACT_INTERNAL_SupportedContent(uint16_t version)

{
  undefined1 local_3;
  uint16_t version_local;
  
  local_3 = true;
  if (((version != 0x2e) && (local_3 = true, version != 0x2d)) && (local_3 = true, version != 0x2c))
  {
    local_3 = version == 0x2b;
  }
  return (int)local_3;
}

Assistant:

static inline int FACT_INTERNAL_SupportedContent(uint16_t version)
{
	return (	version == FACT_CONTENT_VERSION ||
			version == FACT_CONTENT_VERSION_3_4 ||
			version == FACT_CONTENT_VERSION_3_1 ||
			version == FACT_CONTENT_VERSION_3_0	);
}